

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O0

void am_new_points_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,
               Am_Object *new_obj_proto,Am_Value *new_loc)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object local_a8;
  int local_9c;
  Am_Object local_98;
  undefined1 local_8a;
  undefined1 local_89;
  bool beep_on_abort;
  bool override;
  Am_Inter_Location data;
  Am_Object impl_parent;
  Am_Object orig_object;
  Am_Object local_68;
  Am_Object local_60;
  byte local_51;
  bool currently_undone;
  Am_Object owner;
  Am_Object local_38;
  Am_Object new_object;
  Am_Object inter;
  Am_Value *new_loc_local;
  Am_Object *new_obj_proto_local;
  bool reload_data_local;
  bool selective_local;
  bool undo_local;
  Am_Object *command_obj_local;
  
  Am_Object::Am_Object(&new_object);
  Am_Object::Am_Object(&local_38);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffb0);
  pAVar3 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&new_object,pAVar3);
  pAVar3 = Am_Object::Get(command_obj,0x169,0);
  Am_Object::operator=(&local_38,pAVar3);
  pAVar3 = Am_Object::Get(command_obj,0x16f,0);
  local_51 = Am_Value::operator_cast_to_bool(pAVar3);
  if ((bool)local_51) {
    bVar1 = Am_Object::Valid(&local_38);
    if (bVar1) {
      pAVar3 = Am_Object::Get(command_obj,0x171,0);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffb0,pAVar3);
      bVar1 = Am_Object::Valid((Am_Object *)&stack0xffffffffffffffb0);
      if (bVar1) {
        Am_Object::Am_Object(&local_60,&local_38);
        Am_Object::Add_Part((Am_Object *)&stack0xffffffffffffffb0,&local_60,true,0);
        Am_Object::~Am_Object(&local_60);
      }
    }
  }
  else if (undo) {
    bVar1 = Am_Object::Valid(&local_38);
    if (bVar1) {
      Am_Object::Get_Owner(&local_68,(Am_Slot_Flags)&local_38);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffb0,&local_68);
      Am_Object::~Am_Object(&local_68);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&stack0xffffffffffffffb0);
      Am_Object::Set(command_obj,0x171,pAVar4,1);
      Am_Object::Am_Object(&orig_object,&local_38);
      Am_Object::Remove_Part((Am_Object *)&stack0xffffffffffffffb0,&orig_object);
      Am_Object::~Am_Object(&orig_object);
    }
  }
  else {
    bVar1 = Am_Object::Valid(&new_object);
    if (bVar1) {
      Am_Object::Am_Object(&impl_parent);
      Am_Object::Am_Object((Am_Object *)&data);
      if ((reload_data) && (bVar1 = Am_Object::Valid(new_obj_proto), bVar1)) {
        Am_Object::operator=(&impl_parent,new_obj_proto);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&impl_parent);
        Am_Object::Set(command_obj,0x11a,pAVar4,1);
      }
      else {
        pAVar3 = Am_Object::Get(command_obj,0x11a,0);
        Am_Object::operator=(&impl_parent,pAVar3);
      }
      bVar1 = Am_Object::Valid(&impl_parent);
      if (bVar1) {
        Am_Inter_Location::Am_Inter_Location
                  ((Am_Inter_Location *)&stack0xffffffffffffff78,&impl_parent);
        local_89 = 0;
        if ((reload_data) && (bVar1 = Am_Value::Valid(new_loc), bVar1)) {
          Am_Inter_Location::operator=((Am_Inter_Location *)&stack0xffffffffffffff78,new_loc);
          local_89 = 1;
        }
        pAVar3 = Am_Object::Get(command_obj,0xdf,0);
        iVar2 = Am_Value::operator_cast_to_int(pAVar3);
        if (iVar2 < 2) {
LAB_00241ffb:
          am_create_new_object
                    (&local_a8,&new_object,(Am_Inter_Location *)command_obj,
                     (Am_Object *)&stack0xffffffffffffff78,SUB81(&impl_parent,0));
          Am_Object::operator=(&local_38,&local_a8);
          Am_Object::~Am_Object(&local_a8);
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
          Am_Object::Set(command_obj,0x169,pAVar4,0);
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
          Am_Object::Set(command_obj,0x16d,pAVar4,0);
          pAVar3 = Am_Object::Get(command_obj,0x154,0);
          Am_Object::operator=((Am_Object *)&data,pAVar3);
          bVar1 = Am_Object::Valid((Am_Object *)&data);
          if (bVar1) {
            pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
            Am_Object::Set((Am_Object *)&data,0x169,pAVar4,0);
            pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
            Am_Object::Set((Am_Object *)&data,0x16d,pAVar4,0);
          }
          local_51 = 1;
          local_9c = 0;
        }
        else {
          pAVar3 = Am_Object::Get(&new_object,0xd3,0);
          local_8a = Am_Value::operator_cast_to_bool(pAVar3);
          if ((!(bool)local_8a) ||
             (bVar1 = Am_Inter_Location::Is_Zero_Size((Am_Inter_Location *)&stack0xffffffffffffff78)
             , !bVar1)) goto LAB_00241ffb;
          Am_Object::Set(command_obj,0x166,true,1);
          Am_Object::Am_Object(&local_98,&Am_No_Object);
          Am_Beep(&local_98);
          Am_Object::~Am_Object(&local_98);
          local_9c = 1;
        }
        Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&stack0xffffffffffffff78);
        if (local_9c == 0) goto LAB_00242199;
      }
      else {
LAB_00242199:
        local_9c = 0;
      }
      Am_Object::~Am_Object((Am_Object *)&data);
      Am_Object::~Am_Object(&impl_parent);
      if (local_9c != 0) goto LAB_00242207;
    }
  }
  Am_Object::Set(command_obj,0x16f,(bool)(~local_51 & 1),0);
  local_9c = 0;
LAB_00242207:
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffb0);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&new_object);
  return;
}

Assistant:

void
am_new_points_general_undo_redo(Am_Object command_obj, bool undo,
                                bool selective, bool reload_data,
                                Am_Object new_obj_proto,
                                const Am_Value &new_loc)
{
  Am_Object inter, new_object, owner;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  new_object = command_obj.Get(Am_VALUE);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "Repeat";
    std::cout << " command " << command_obj << " on obj " << new_object
              << std::endl
              << std::flush;
  }
#endif

  //assume created object is always on top, so OK to undo it to the top
  bool currently_undone = command_obj.Get(Am_HAS_BEEN_UNDONE);
  if (currently_undone) {
    if (new_object.Valid()) {
      //then put it back
      owner = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
      if (owner.Valid()) {
#ifdef DEBUG
        if (inter.Valid() && Am_Inter_Tracing(inter))
          std::cout << "++Adding " << new_object << " back to owner " << owner
                    << std::endl
                    << std::flush;
#endif
        owner.Add_Part(new_object);
      }
    }
  } else {
    if (undo) {
      if (new_object.Valid()) {
        // remove it
        owner = new_object.Get_Owner();
        command_obj.Set(Am_SAVED_OLD_OBJECT_OWNER, owner, Am_OK_IF_NOT_THERE);
#ifdef DEBUG
        if (inter.Valid() && Am_Inter_Tracing(inter))
          std::cout << "++Removing " << new_object << " from owner " << owner
                    << std::endl
                    << std::flush;
#endif
        owner.Remove_Part(new_object);
      }
    } else { // selective repeat, create a new object
      if (inter.Valid()) {
        Am_Object orig_object, impl_parent;
        if (reload_data && new_obj_proto.Valid()) {
          orig_object = new_obj_proto;
          command_obj.Set(Am_START_OBJECT, orig_object, Am_OK_IF_NOT_THERE);
        } else
          orig_object = command_obj.Get(Am_START_OBJECT);
        if (orig_object.Valid()) {
          // command_obj.Get(Am_INTERIM_VALUE);
          Am_Inter_Location data(orig_object);
          bool override = false;
          if (reload_data && new_loc.Valid()) {
            data = new_loc;
            override = true;
          }
          //if only one point, then size doesn't matter
          if ((int)command_obj.Get(Am_HOW_MANY_POINTS) >= 2) {
            bool beep_on_abort = inter.Get(Am_INTER_BEEP_ON_ABORT);
            if (beep_on_abort && data.Is_Zero_Size()) {
              Am_INTER_TRACE_PRINT(inter, "Aborting " << command_obj
                                                      << " because zero size");
              //not queued for undo
              command_obj.Set(Am_COMMAND_IS_ABORTING, true, Am_OK_IF_NOT_THERE);
              Am_Beep();
              return;
            }
          }
          new_object = am_create_new_object(inter, command_obj, data,
                                            orig_object, override);
          Am_INTER_TRACE_PRINT(inter, "++Created new object " << new_object
                                                              << " at location "
                                                              << data);
          command_obj.Set(Am_VALUE, new_object);
          command_obj.Set(Am_OBJECT_MODIFIED, new_object);
          impl_parent = command_obj.Get(Am_IMPLEMENTATION_PARENT);
          if (impl_parent.Valid()) {
            impl_parent.Set(Am_VALUE, new_object);
            impl_parent.Set(Am_OBJECT_MODIFIED, new_object);
          }
          currently_undone = true; //so set below will make it false
        }
      }
    }
  }
  command_obj.Set(Am_HAS_BEEN_UNDONE, !currently_undone);
}